

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O0

string * to_timestamp_abi_cxx11_(int64_t t,bool comma)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte in_DL;
  long in_RSI;
  string *in_RDI;
  char buf [32];
  int64_t sec;
  int64_t min;
  int64_t hr;
  int64_t msec;
  char *local_98;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffff94;
  allocator<char> local_59;
  allocator<char> local_58 [32];
  ulong local_38;
  ulong local_30;
  ulong local_28;
  long local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_28 = (in_RSI * 10) / 3600000;
  local_20 = (in_RSI * 10) % 3600000;
  local_30 = local_20 / 60000;
  local_20 = local_20 % 60000;
  local_38 = local_20 / 1000;
  local_20 = local_20 % 1000;
  __a = local_58;
  uVar1 = (undefined4)local_28;
  uVar2 = (undefined4)local_30;
  uVar3 = (undefined4)local_38;
  if (local_11 == 0) {
    local_98 = ".";
  }
  else {
    local_98 = ",";
  }
  snprintf((char *)__a,0x20,"%02d:%02d:%02d%s%03d",local_28 & 0xffffffff,local_30 & 0xffffffff,
           local_38 & 0xffffffff,local_98,(undefined4)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff94,uVar3),(char *)CONCAT44(uVar2,uVar1),__a);
  std::allocator<char>::~allocator(&local_59);
  return in_RDI;
}

Assistant:

std::string to_timestamp(int64_t t, bool comma) {
    int64_t msec = t * 10;
    int64_t hr = msec / (1000 * 60 * 60);
    msec = msec - hr * (1000 * 60 * 60);
    int64_t min = msec / (1000 * 60);
    msec = msec - min * (1000 * 60);
    int64_t sec = msec / 1000;
    msec = msec - sec * 1000;

    char buf[32];
    snprintf(buf, sizeof(buf), "%02d:%02d:%02d%s%03d", (int) hr, (int) min, (int) sec, comma ? "," : ".", (int) msec);

    return std::string(buf);
}